

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readCoreScanlinePart
               (exr_context_t f,int part,bool reduceMemory,bool reduceTime)

{
  long lVar1;
  byte in_CL;
  byte in_DL;
  undefined4 in_ESI;
  undefined8 in_RDI;
  exr_coding_channel_info_t *outc_1;
  int c_1;
  uint8_t *dptr;
  exr_coding_channel_info_t *outc;
  int c;
  uint64_t bytes;
  int y;
  exr_chunk_info_t cinfo;
  uint64_t chunk;
  int32_t lines_per_chunk;
  exr_decode_pipeline_t decoder;
  bool doread;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  uint64_t height;
  uint64_t width;
  exr_attr_box2i_t datawin;
  exr_result_t rv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd30;
  int local_2bc;
  ulong local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  ulong local_260;
  undefined4 local_258;
  int local_244;
  long local_240;
  short local_238;
  byte local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_40;
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  byte local_16;
  byte local_15;
  undefined4 local_14;
  undefined8 local_10;
  bool local_1;
  
  local_15 = in_DL & 1;
  local_16 = in_CL & 1;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_1c = exr_get_data_window(in_RDI,in_ESI,&local_2c);
  if (local_1c == 0) {
    local_38 = ((long)local_24 - (long)local_2c) + 1;
    local_40 = ((long)local_20 - (long)local_28) + 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116f10);
    local_59 = 0;
    memset(&local_240,0,0x1e0);
    local_1c = exr_get_scanlines_per_chunk(local_10,local_14,&local_244);
    if (local_1c == 0) {
      for (local_260 = 0; local_260 < local_40; local_260 = (long)local_244 + local_260) {
        local_278 = 0;
        uStack_270 = 0;
        local_288 = 0;
        uStack_280 = 0;
        local_298 = 0;
        uStack_290 = 0;
        local_2a8 = 0;
        uStack_2a0 = 0;
        local_1c = exr_read_scanline_chunk_info
                             (local_10,local_14,(int)local_260 + local_28,&local_2a8);
        if (local_1c == 0) {
          if (local_240 == 0) {
            local_1c = exr_decoding_initialize(local_10,local_14,&local_2a8,&local_240);
            if (local_1c != 0) break;
            local_2b8 = 0;
            for (local_2bc = 0; local_2bc < local_238; local_2bc = local_2bc + 1) {
              lVar1 = local_240 + (long)local_2bc * 0x30;
              *(undefined8 *)(lVar1 + 0x28) = 0x1000;
              *(int *)(lVar1 + 0x20) = (int)*(short *)(lVar1 + 0x1c);
              *(int *)(lVar1 + 0x24) = *(int *)(lVar1 + 0x20) * (int)local_38;
              local_2b8 = local_38 * *(short *)(lVar1 + 0x1c) * (long)local_244 + local_2b8;
            }
            local_59 = 1;
            if (((local_15 & 1) != 0) && (7999999 < local_2b8)) {
              local_59 = 0;
            }
            if (local_59 != 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffd30,
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            }
            local_1c = exr_decoding_choose_default_routines(local_10,local_14,&local_240);
            if (local_1c != 0) break;
          }
          else {
            local_1c = exr_decoding_update(local_10,local_14,&local_2a8,&local_240);
            if (local_1c != 0) goto joined_r0x00117209;
          }
          if ((local_59 & 1) != 0) {
            in_stack_fffffffffffffd30 =
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_58,0)
            ;
            for (in_stack_fffffffffffffd2c = 0; in_stack_fffffffffffffd2c < local_238;
                in_stack_fffffffffffffd2c = in_stack_fffffffffffffd2c + 1) {
              in_stack_fffffffffffffd20 =
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (local_240 + (long)in_stack_fffffffffffffd2c * 0x30);
              in_stack_fffffffffffffd20[1].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd30;
              *(int *)&in_stack_fffffffffffffd20[1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish =
                   (int)*(short *)((long)&in_stack_fffffffffffffd20[1].
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4);
              *(int *)((long)&in_stack_fffffffffffffd20[1].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 4) =
                   *(int *)&in_stack_fffffffffffffd20[1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish * (int)local_38;
              in_stack_fffffffffffffd30 =
                   (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_stack_fffffffffffffd30->_M_impl)->_M_impl +
                   local_38 *
                   *(short *)((long)&in_stack_fffffffffffffd20[1].
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 4) *
                   (long)local_244);
            }
            local_1c = exr_decoding_run(local_10,local_14,&local_240);
            if (local_1c != 0) goto joined_r0x00117209;
          }
        }
        else {
joined_r0x00117209:
          if ((local_16 & 1) != 0) break;
        }
      }
      exr_decoding_destroy(local_10,&local_240);
      local_1 = local_1c != 0;
    }
    else {
      local_1 = true;
    }
    local_258 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffd20);
  }
  else {
    local_1 = true;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool
readCoreScanlinePart (
    exr_context_t f, int part, bool reduceMemory, bool reduceTime)
{
    exr_result_t     rv;
    exr_attr_box2i_t datawin;
    rv = exr_get_data_window (f, part, &datawin);
    if (rv != EXR_ERR_SUCCESS) return true;

    uint64_t width =
        (uint64_t) ((int64_t) datawin.max.x - (int64_t) datawin.min.x + 1);
    uint64_t height =
        (uint64_t) ((int64_t) datawin.max.y - (int64_t) datawin.min.y + 1);

    std::vector<uint8_t>  imgdata;
    bool                  doread = false;
    exr_decode_pipeline_t decoder = EXR_DECODE_PIPELINE_INITIALIZER;

    int32_t lines_per_chunk;
    rv = exr_get_scanlines_per_chunk (f, part, &lines_per_chunk);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (uint64_t chunk = 0; chunk < height; chunk += lines_per_chunk)
    {
        exr_chunk_info_t cinfo = {0};
        int              y     = ((int) chunk) + datawin.min.y;

        rv = exr_read_scanline_chunk_info (f, part, y, &cinfo);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (reduceTime) break;
            continue;
        }

        if (decoder.channels == NULL)
        {
            rv = exr_decoding_initialize (f, part, &cinfo, &decoder);
            if (rv != EXR_ERR_SUCCESS) break;

            uint64_t bytes = 0;
            for (int c = 0; c < decoder.channel_count; c++)
            {
                exr_coding_channel_info_t& outc = decoder.channels[c];
                // fake addr for default routines
                outc.decode_to_ptr     = (uint8_t*) 0x1000;
                outc.user_pixel_stride = outc.user_bytes_per_element;
                outc.user_line_stride  = outc.user_pixel_stride * width;
                bytes += width * (uint64_t) outc.user_bytes_per_element *
                         (uint64_t) lines_per_chunk;
            }

            // TODO: check we are supposed to multiple by lines per chunk above
            doread = true;
            if (reduceMemory && bytes >= gMaxBytesPerScanline) doread = false;

            if (doread) imgdata.resize (bytes);
            rv = exr_decoding_choose_default_routines (f, part, &decoder);
            if (rv != EXR_ERR_SUCCESS) break;
        }
        else
        {
            rv = exr_decoding_update (f, part, &cinfo, &decoder);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (reduceTime) break;
                continue;
            }
        }

        if (doread)
        {
            uint8_t* dptr = &(imgdata[0]);
            for (int c = 0; c < decoder.channel_count; c++)
            {
                exr_coding_channel_info_t& outc = decoder.channels[c];
                outc.decode_to_ptr              = dptr;
                outc.user_pixel_stride          = outc.user_bytes_per_element;
                outc.user_line_stride = outc.user_pixel_stride * width;
                dptr += width * (uint64_t) outc.user_bytes_per_element *
                        (uint64_t) lines_per_chunk;
            }

            rv = exr_decoding_run (f, part, &decoder);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (reduceTime) break;
            }
        }
    }

    exr_decoding_destroy (f, &decoder);

    return (rv != EXR_ERR_SUCCESS);
}